

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

void __thiscall Json::RuntimeError::RuntimeError(RuntimeError *this,String *msg)

{
  String local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)msg);
  Exception::Exception(&this->super_Exception,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  *(undefined ***)&this->super_Exception = &PTR__Exception_00a2c9b0;
  return;
}

Assistant:

RuntimeError::RuntimeError(String const& msg) : Exception(msg) {}